

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QCalendarBackend::dateTimeToString
          (QCalendarBackend *this,QStringView format,QDateTime *datetime,QDate dateOnly,
          QTime timeOnly,QLocale *locale)

{
  QLatin1StringView s;
  QStringView s_00;
  QLatin1StringView s_01;
  QStringView format_00;
  QStringView format_01;
  bool bVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char16_t cVar7;
  FormatType FVar8;
  int iVar9;
  time_t tVar10;
  qint64 qVar11;
  qsizetype qVar12;
  char16_t *pcVar13;
  int *piVar14;
  storage_type_conflict *in_RCX;
  qsizetype in_RDX;
  long *in_RSI;
  long *__timer;
  QString *in_RDI;
  QDateTime *in_R8;
  undefined1 *in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  undefined8 in_stack_00000010;
  int hour;
  bool used;
  qsizetype rep;
  int day;
  int month;
  int year;
  bool formatTime;
  bool formatDate;
  QString text_1;
  QDateTime when;
  anon_class_8_1_5fb9ff98 tzAbbr;
  QString text;
  int repeat;
  QChar c;
  qsizetype i;
  anon_class_1_0_00000001 formatType;
  anon_class_16_2_4001139c appendToResult;
  YearMonthDay parts;
  QString result;
  QTime time;
  QDate date;
  undefined4 in_stack_fffffffffffffbf8;
  CaseSensitivity in_stack_fffffffffffffbfc;
  QString *in_stack_fffffffffffffc00;
  QStringView *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  QString *this_00;
  undefined4 in_stack_fffffffffffffc18;
  undefined2 in_stack_fffffffffffffc1c;
  QChar in_stack_fffffffffffffc1e;
  QString *in_stack_fffffffffffffc20;
  undefined2 in_stack_fffffffffffffc28;
  byte in_stack_fffffffffffffc2a;
  byte in_stack_fffffffffffffc2b;
  undefined2 in_stack_fffffffffffffc2c;
  QChar in_stack_fffffffffffffc2e;
  undefined4 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3c;
  undefined1 in_stack_fffffffffffffc3d;
  undefined1 in_stack_fffffffffffffc3e;
  undefined1 in_stack_fffffffffffffc3f;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  anon_class_16_2_4001139c *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  AbbrType in_stack_fffffffffffffc74;
  QDateTime *in_stack_fffffffffffffc78;
  anon_class_8_1_5fb9ff98 *in_stack_fffffffffffffc80;
  FormatType in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  int local_2a4;
  int local_2a0;
  QStringView local_278;
  QChar local_25a [25];
  QString local_228;
  undefined1 *local_208;
  int local_1fc;
  undefined1 *local_1f8;
  int local_1bc [8];
  QChar local_19a [15];
  QChar local_17c;
  QChar local_17a;
  QStringView local_178;
  undefined1 *local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  int local_144 [3];
  qsizetype local_138;
  storage_type_conflict *psStack_130;
  int local_124 [8];
  int local_104;
  undefined1 local_100 [24];
  int local_e8;
  char16_t local_e2;
  int local_e0;
  QChar local_da;
  qsizetype local_d8;
  storage_type_conflict *psStack_d0;
  QChar local_a2;
  long local_a0;
  anon_class_1_0_00000001 local_91;
  undefined8 local_90;
  QString *local_88;
  YearMonthDay local_80;
  YearMonthDay local_70;
  QString local_60;
  int local_44;
  qint64 local_40;
  QTime local_34;
  QDate local_30;
  QTime local_24;
  undefined1 *local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.mds = in_stack_00000008;
  local_30.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  __timer = in_RSI;
  local_20 = in_R9;
  local_18.m_size = in_RDX;
  local_18.m_data = in_RCX;
  QDate::QDate((QDate *)in_stack_fffffffffffffc00);
  local_34.mds = -0x55555556;
  QTime::QTime(&local_34);
  bVar1 = false;
  bVar5 = false;
  bVar4 = QDateTime::isValid((QDateTime *)in_stack_fffffffffffffc00);
  if (bVar4) {
    local_40 = (qint64)QDateTime::date((QDateTime *)in_stack_fffffffffffffc08);
    local_30 = (QDate)local_40;
    tVar10 = QDateTime::time(in_R8,__timer);
    local_44 = (int)tVar10;
    bVar1 = true;
    bVar5 = true;
    local_34.mds = local_44;
  }
  else {
    bVar4 = QDate::isValid((QDate *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    if (bVar4) {
      local_30.jd = (qint64)local_20;
      bVar1 = true;
    }
    else {
      bVar5 = QTime::isValid(&local_24);
      if (!bVar5) {
        QString::QString((QString *)0x4d444c);
        goto LAB_004d56a9;
      }
      local_34.mds = local_24.mds;
      bVar5 = true;
    }
  }
  local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x4d448f);
  local_2a0 = 0;
  local_2a4 = 0;
  if (bVar1) {
    local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_70.day = -0x55555556;
    qVar11 = QDate::toJulianDay(&local_30);
    local_80 = (YearMonthDay)(**(code **)(*in_RSI + 0x88))(in_RSI,qVar11);
    local_70 = local_80;
    bVar4 = QCalendar::YearMonthDay::isValid(&local_70);
    if (bVar4) {
      local_2a0 = local_70.year;
      local_2a4 = local_70.month;
      goto LAB_004d45e2;
    }
    QString::QString((QString *)0x4d458b);
  }
  else {
LAB_004d45e2:
    this_00 = (QString *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
    local_90 = in_stack_00000010;
    local_88 = &local_60;
    local_91 = (anon_class_1_0_00000001)0xaa;
    local_a0 = 0;
    while( true ) {
      lVar3 = local_a0;
      qVar12 = QStringView::size(&local_18);
      if (qVar12 <= lVar3) break;
      local_a2 = QStringView::at(in_stack_fffffffffffffc08,(qsizetype)in_stack_fffffffffffffc00);
      pcVar13 = QChar::unicode(&local_a2);
      if (*pcVar13 == L'\'') {
        local_d8 = local_18.m_size;
        psStack_d0 = local_18.m_data;
        format_01.m_data._0_4_ = in_stack_fffffffffffffc88;
        format_01.m_size = (qsizetype)in_stack_fffffffffffffc80;
        format_01.m_data._4_4_ = in_stack_fffffffffffffc8c;
        qt_readEscapedFormatString
                  (format_01,
                   (qsizetype *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        QString::append((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        QString::~QString((QString *)0x4d46fb);
      }
      else {
        local_da.ucs = L'ꪪ';
        local_da = QStringView::at(in_stack_fffffffffffffc08,(qsizetype)in_stack_fffffffffffffc00);
        QStringView::mid((QStringView *)
                         CONCAT26(in_stack_fffffffffffffc1e.ucs,
                                  CONCAT24(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)),
                         CONCAT26(in_stack_fffffffffffffc2e.ucs,
                                  CONCAT24(in_stack_fffffffffffffc2c,
                                           CONCAT13(in_stack_fffffffffffffc2b,
                                                    CONCAT12(in_stack_fffffffffffffc2a,
                                                             in_stack_fffffffffffffc28)))),
                         (qsizetype)in_stack_fffffffffffffc20);
        s_00.m_data._0_2_ = in_stack_fffffffffffffc28;
        s_00.m_size = (qsizetype)in_stack_fffffffffffffc20;
        s_00.m_data._2_1_ = in_stack_fffffffffffffc2a;
        s_00.m_data._3_1_ = in_stack_fffffffffffffc2b;
        s_00.m_data._4_2_ = in_stack_fffffffffffffc2c;
        s_00.m_data._6_2_ = in_stack_fffffffffffffc2e.ucs;
        qVar12 = qt_repeatCount(s_00);
        local_e0 = (int)qVar12;
        bVar4 = false;
        if (bVar1) {
          cVar7 = QChar::unicode(&local_da);
          if (cVar7 == L'M') {
            bVar4 = true;
            local_e8 = 4;
            piVar14 = qMin<int>(&local_e0,&local_e8);
            uVar2 = in_stack_00000010;
            local_e0 = *piVar14;
            if (local_e0 < 3) {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                         in_stack_fffffffffffffc40);
            }
            else {
              FVar8 = dateTimeToString::anon_class_1_0_00000001::operator()(&local_91,local_e0);
              (**(code **)(*in_RSI + 0xa0))(local_100,in_RSI,uVar2,local_2a4,local_2a0,FVar8);
              QString::append((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
              QString::~QString((QString *)0x4d4a0f);
            }
          }
          else if (cVar7 == L'd') {
            bVar4 = true;
            local_104 = 4;
            piVar14 = qMin<int>(&local_e0,&local_104);
            local_e0 = *piVar14;
            if (local_e0 < 3) {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                         in_stack_fffffffffffffc40);
            }
            else {
              qVar11 = QDate::toJulianDay(&local_30);
              in_stack_fffffffffffffc8c = (**(code **)(*in_RSI + 0x90))(in_RSI,qVar11);
              in_stack_fffffffffffffc88 =
                   dateTimeToString::anon_class_1_0_00000001::operator()(&local_91,local_e0);
              QLocale::dayName((QLocale *)
                               CONCAT26(in_stack_fffffffffffffc1e.ucs,
                                        CONCAT24(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18
                                                )),(int)((ulong)this_00 >> 0x20),(FormatType)this_00
                              );
              QString::append((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
              QString::~QString((QString *)0x4d4b61);
            }
          }
          else if (cVar7 == L'y') {
            bVar4 = true;
            if (local_e0 < 4) {
              if (1 < local_e0) {
                local_e0 = 2;
              }
            }
            else {
              local_e0 = 4;
            }
            if (local_e0 == 2) {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                         in_stack_fffffffffffffc40);
            }
            else if (local_e0 == 4) {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
                         in_stack_fffffffffffffc40);
            }
            else {
              local_e0 = 1;
              local_e2 = local_da.ucs;
              QString::append(this_00,in_stack_fffffffffffffc1e);
            }
          }
        }
        if ((!bVar4) && (bVar5)) {
          cVar7 = QChar::unicode(&local_da);
          in_stack_fffffffffffffc80 = (anon_class_8_1_5fb9ff98 *)(ulong)((ushort)cVar7 - 0x41);
          switch(in_stack_fffffffffffffc80) {
          case (anon_class_8_1_5fb9ff98 *)0x0:
          case (anon_class_8_1_5fb9ff98 *)0x20:
            local_168 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
            local_158 = &DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffc40 =
                 QTime::hour((QTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
            ;
            if (in_stack_fffffffffffffc40 < 0xc) {
              QLocale::amText((QLocale *)
                              CONCAT17(in_stack_fffffffffffffc3f,
                                       CONCAT16(in_stack_fffffffffffffc3e,
                                                CONCAT15(in_stack_fffffffffffffc3d,
                                                         CONCAT14(in_stack_fffffffffffffc3c,
                                                                  in_stack_fffffffffffffc38)))));
            }
            else {
              QLocale::pmText((QLocale *)
                              CONCAT17(in_stack_fffffffffffffc3f,
                                       CONCAT16(in_stack_fffffffffffffc3e,
                                                CONCAT15(in_stack_fffffffffffffc3d,
                                                         CONCAT14(in_stack_fffffffffffffc3c,
                                                                  in_stack_fffffffffffffc38)))));
            }
            bVar4 = true;
            local_e0 = 1;
            local_178 = QStringView::mid((QStringView *)
                                         CONCAT26(in_stack_fffffffffffffc1e.ucs,
                                                  CONCAT24(in_stack_fffffffffffffc1c,
                                                           in_stack_fffffffffffffc18)),
                                         CONCAT26(in_stack_fffffffffffffc2e.ucs,
                                                  CONCAT24(in_stack_fffffffffffffc2c,
                                                           CONCAT13(in_stack_fffffffffffffc2b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffc2a,
                                                  in_stack_fffffffffffffc28)))),
                                         (qsizetype)in_stack_fffffffffffffc20);
            QChar::QChar<char16_t,_true>(&local_17a,L'p');
            bVar6 = QStringView::startsWith
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                               in_stack_fffffffffffffc2e,CaseInsensitive);
            if (bVar6) {
              local_e0 = local_e0 + 1;
            }
            cVar7 = QChar::unicode(&local_da);
            in_stack_fffffffffffffc3f = false;
            if ((cVar7 == L'A') &&
               (in_stack_fffffffffffffc3e = true,
               in_stack_fffffffffffffc3f = in_stack_fffffffffffffc3e, local_e0 != 1)) {
              local_17c = QStringView::at(in_stack_fffffffffffffc08,
                                          (qsizetype)in_stack_fffffffffffffc00);
              pcVar13 = QChar::unicode(&local_17c);
              in_stack_fffffffffffffc3e = *pcVar13 == L'P';
              in_stack_fffffffffffffc3f = in_stack_fffffffffffffc3e;
            }
            if ((bool)in_stack_fffffffffffffc3f == false) {
              cVar7 = QChar::unicode(&local_da);
              in_stack_fffffffffffffc3d = false;
              if ((cVar7 == L'a') &&
                 (in_stack_fffffffffffffc3c = true,
                 in_stack_fffffffffffffc3d = in_stack_fffffffffffffc3c, local_e0 != 1)) {
                local_19a[0] = QStringView::at(in_stack_fffffffffffffc08,
                                               (qsizetype)in_stack_fffffffffffffc00);
                pcVar13 = QChar::unicode(local_19a);
                in_stack_fffffffffffffc3c = *pcVar13 == L'p';
                in_stack_fffffffffffffc3d = in_stack_fffffffffffffc3c;
              }
              if ((bool)in_stack_fffffffffffffc3d != false) {
                QString::toLower((QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
                QString::operator=(in_stack_fffffffffffffc00,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
                QString::~QString((QString *)0x4d50ac);
              }
            }
            else {
              QString::toUpper((QString *)
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              QString::operator=(in_stack_fffffffffffffc00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              QString::~QString((QString *)0x4d4fcc);
            }
            QString::append((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
            QString::~QString((QString *)0x4d50dd);
            break;
          default:
            break;
          case (anon_class_8_1_5fb9ff98 *)0x7:
            bVar4 = true;
            local_144[2] = 2;
            piVar14 = qMin<int>(&local_e0,local_144 + 2);
            local_e0 = *piVar14;
            QTime::hour((QTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                      );
            break;
          case (anon_class_8_1_5fb9ff98 *)0x27:
            bVar4 = true;
            local_124[0] = 2;
            in_stack_fffffffffffffc78 = (QDateTime *)qMin<int>(&local_e0,local_124);
            local_e0 = *(int *)&in_stack_fffffffffffffc78->d;
            in_stack_fffffffffffffc74 =
                 QTime::hour((QTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
            ;
            local_138 = local_18.m_size;
            psStack_130 = local_18.m_data;
            format_00.m_size._4_4_ = in_stack_fffffffffffffc44;
            format_00.m_size._0_4_ = in_stack_fffffffffffffc40;
            format_00.m_data = (storage_type_conflict *)in_stack_fffffffffffffc48;
            timeFormatContainsAP(format_00);
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                      );
            break;
          case (anon_class_8_1_5fb9ff98 *)0x2c:
            bVar4 = true;
            local_144[1] = 2;
            piVar14 = qMin<int>(&local_e0,local_144 + 1);
            local_e0 = *piVar14;
            in_stack_fffffffffffffc54 =
                 QTime::minute((QTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8
                                                ));
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                      );
            break;
          case (anon_class_8_1_5fb9ff98 *)0x32:
            bVar4 = true;
            local_144[0] = 2;
            in_stack_fffffffffffffc48 = (anon_class_16_2_4001139c *)qMin<int>(&local_e0,local_144);
            local_e0 = *(int *)&in_stack_fffffffffffffc48->locale;
            in_stack_fffffffffffffc44 =
                 QTime::second((QTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8
                                                ));
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                      );
            break;
          case (anon_class_8_1_5fb9ff98 *)0x33:
            local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
            QLocale::QLocale((QLocale *)in_stack_fffffffffffffc00,
                             (QLocale *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            bVar4 = true;
            local_1fc = 4;
            in_stack_fffffffffffffc20 = (QString *)qMin<int>(&local_e0,&local_1fc);
            local_e0 = *(int *)&(in_stack_fffffffffffffc20->d).d;
            local_208 = &DAT_aaaaaaaaaaaaaaaa;
            if (bVar1) {
              QDateTime::QDateTime
                        ((QDateTime *)in_stack_fffffffffffffc00,
                         (QDateTime *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
              ;
            }
            else {
              QDateTime::currentDateTime();
            }
            local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QString::QString((QString *)0x4d534e);
            in_stack_fffffffffffffc1c = (undefined2)local_e0;
            in_stack_fffffffffffffc1e.ucs = (char16_t)((uint)local_e0 >> 0x10);
            if (local_e0 - 2U < 2) {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc74);
              QString::operator=(in_stack_fffffffffffffc00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              QString::~QString((QString *)0x4d5457);
              if (local_e0 == 2) {
                QChar::QChar<char16_t,_true>(local_25a,L':');
                QString::remove(&local_228,(char *)(ulong)(ushort)local_25a[0].ucs);
              }
            }
            else if (local_e0 == 4) {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc74);
              QString::operator=(in_stack_fffffffffffffc00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              QString::~QString((QString *)0x4d53d5);
            }
            else {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc74);
              this_00 = &local_228;
              in_stack_fffffffffffffc08 = &local_278;
              QString::operator=(in_stack_fffffffffffffc00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              QString::~QString((QString *)0x4d54e3);
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00);
              s_01.m_data._0_2_ = in_stack_fffffffffffffc28;
              s_01.m_size = (qsizetype)in_stack_fffffffffffffc20;
              s_01.m_data._2_1_ = in_stack_fffffffffffffc2a;
              s_01.m_data._3_1_ = in_stack_fffffffffffffc2b;
              s_01.m_data._4_2_ = in_stack_fffffffffffffc2c;
              s_01.m_data._6_2_ = in_stack_fffffffffffffc2e.ucs;
              bVar6 = QString::startsWith((QString *)
                                          CONCAT44(in_stack_fffffffffffffbfc,
                                                   in_stack_fffffffffffffbf8),s_01,CaseInsensitive);
              in_stack_fffffffffffffc18 = CONCAT13(bVar6,(int3)in_stack_fffffffffffffc18);
              if (bVar6) {
                qVar12 = QString::size(&local_228);
                if (qVar12 == 6) {
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00);
                  s.m_data._0_4_ = in_stack_fffffffffffffc18;
                  s.m_size = (qsizetype)this_00;
                  s.m_data._4_2_ = in_stack_fffffffffffffc1c;
                  s.m_data._6_2_ = in_stack_fffffffffffffc1e.ucs;
                  QString::operator+=((QString *)
                                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                                      s);
                }
              }
            }
            bVar6 = QString::isEmpty((QString *)0x4d5597);
            if (!bVar6) {
              QString::append((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
            }
            QString::~QString((QString *)0x4d55cc);
            QDateTime::~QDateTime((QDateTime *)0x4d55d9);
            dateTimeToString(QStringView,QDateTime_const&,QDate,QTime,QLocale_const&)::~__2
                      ((anon_class_8_1_5fb9ff98 *)0x4d55e6);
            break;
          case (anon_class_8_1_5fb9ff98 *)0x39:
            bVar4 = true;
            local_1bc[0] = 3;
            piVar14 = qMin<int>(&local_e0,local_1bc);
            local_e0 = *piVar14;
            iVar9 = QTime::msec((QTime *)CONCAT44(in_stack_fffffffffffffbfc,
                                                  in_stack_fffffffffffffbf8));
            in_stack_fffffffffffffc2c = (undefined2)iVar9;
            in_stack_fffffffffffffc2e.ucs = (char16_t)((uint)iVar9 >> 0x10);
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,in_stack_fffffffffffffc40
                      );
            if (local_e0 != 3) {
              QLocale::zeroDigit((QLocale *)in_stack_fffffffffffffc08);
              in_stack_fffffffffffffc2b =
                   QString::endsWith((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                     in_stack_fffffffffffffbfc);
              QString::~QString((QString *)0x4d519c);
              if ((in_stack_fffffffffffffc2b & 1) != 0) {
                QString::chop(in_stack_fffffffffffffc00,
                              CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              }
              QLocale::zeroDigit((QLocale *)in_stack_fffffffffffffc08);
              in_stack_fffffffffffffc2a =
                   QString::endsWith((QString *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                     in_stack_fffffffffffffbfc);
              QString::~QString((QString *)0x4d522a);
              if ((in_stack_fffffffffffffc2a & 1) != 0) {
                QString::chop(in_stack_fffffffffffffc00,
                              CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              }
            }
          }
        }
        if (!bVar4) {
          in_stack_fffffffffffffc00 = &local_60;
          QString::size(in_stack_fffffffffffffc00);
          QString::resize(in_stack_fffffffffffffc20,
                          CONCAT26(in_stack_fffffffffffffc1e.ucs,
                                   CONCAT24(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)),
                          in_stack_fffffffffffffc2e);
        }
        local_a0 = local_e0 + local_a0;
      }
    }
    QString::QString(in_stack_fffffffffffffc00,
                     (QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  }
  QString::~QString((QString *)0x4d5698);
LAB_004d56a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QCalendarBackend::dateTimeToString(QStringView format, const QDateTime &datetime,
                                           QDate dateOnly, QTime timeOnly,
                                           const QLocale &locale) const
{
    QDate date;
    QTime time;
    bool formatDate = false;
    bool formatTime = false;
    if (datetime.isValid()) {
        date = datetime.date();
        time = datetime.time();
        formatDate = true;
        formatTime = true;
    } else if (dateOnly.isValid()) {
        date = dateOnly;
        formatDate = true;
    } else if (timeOnly.isValid()) {
        time = timeOnly;
        formatTime = true;
    } else {
        return QString();
    }

    QString result;
    int year = 0, month = 0, day = 0;
    if (formatDate) {
        const auto parts = julianDayToDate(date.toJulianDay());
        if (!parts.isValid())
            return QString();
        year = parts.year;
        month = parts.month;
        day = parts.day;
    }

    auto appendToResult = [&](int t, int repeat) {
        auto data = locale.d->m_data;
        if (repeat > 1)
            result.append(data->longLongToString(t, -1, 10, repeat, QLocaleData::ZeroPadded));
        else
            result.append(data->longLongToString(t));
    };

    auto formatType = [](int repeat) {
        return repeat == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    };

    qsizetype i = 0;
    while (i < format.size()) {
        if (format.at(i).unicode() == '\'') {
            result.append(qt_readEscapedFormatString(format, &i));
            continue;
        }

        const QChar c = format.at(i);
        qsizetype rep = qt_repeatCount(format.mid(i));
        Q_ASSERT(rep < std::numeric_limits<int>::max());
        int repeat = int(rep);
        bool used = false;
        if (formatDate) {
            switch (c.unicode()) {
            case 'y':
                used = true;
                if (repeat >= 4)
                    repeat = 4;
                else if (repeat >= 2)
                    repeat = 2;

                switch (repeat) {
                case 4:
                    appendToResult(year, (year < 0) ? 5 : 4);
                    break;
                case 2:
                    appendToResult(year % 100, 2);
                    break;
                default:
                    repeat = 1;
                    result.append(c);
                    break;
                }
                break;

            case 'M':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(month, repeat);
                else
                    result.append(monthName(locale, month, year, formatType(repeat)));
                break;

            case 'd':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(day, repeat);
                else
                    result.append(
                            locale.dayName(dayOfWeek(date.toJulianDay()), formatType(repeat)));
                break;

            default:
                break;
            }
        }
        if (!used && formatTime) {
            switch (c.unicode()) {
            case 'h': {
                used = true;
                repeat = qMin(repeat, 2);
                int hour = time.hour();
                if (timeFormatContainsAP(format)) {
                    if (hour > 12)
                        hour -= 12;
                    else if (hour == 0)
                        hour = 12;
                }
                appendToResult(hour, repeat);
                break;
            }
            case 'H':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.hour(), repeat);
                break;

            case 'm':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.minute(), repeat);
                break;

            case 's':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.second(), repeat);
                break;

            case 'A':
            case 'a': {
                QString text = time.hour() < 12 ? locale.amText() : locale.pmText();
                used = true;
                repeat = 1;
                if (format.mid(i + 1).startsWith(u'p', Qt::CaseInsensitive))
                    ++repeat;
                if (c.unicode() == 'A' && (repeat == 1 || format.at(i + 1).unicode() == 'P'))
                    text = std::move(text).toUpper();
                else if (c.unicode() == 'a' && (repeat == 1 || format.at(i + 1).unicode() == 'p'))
                    text = std::move(text).toLower();
                // else 'Ap' or 'aP' => use CLDR text verbatim, preserving case
                result.append(text);
                break;
            }

            case 'z':
                used = true;
                repeat = qMin(repeat, 3);

                // note: the millisecond component is treated like the decimal part of the seconds
                // so ms == 2 is always printed as "002", but ms == 200 can be either "2" or "200"
                appendToResult(time.msec(), 3);
                if (repeat != 3) {
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                }
                break;

            case 't': {
                enum AbbrType { Long, Offset, Short };
                const auto tzAbbr = [locale](const QDateTime &when, AbbrType type) {
                    QString text;
                    if (type == Offset) {
                        text = QtTimeZoneLocale::zoneOffsetFormat(locale, locale.d->m_index,
                                                                  QLocale::ShortFormat,
                                                                  when, when.offsetFromUtc());
                        // When using timezone_locale data, this should always succeed:
                        if (!text.isEmpty())
                            return text;
                    }
#if QT_CONFIG(timezone)
                    if (type != Short || locale != QLocale::system()) {
                        QTimeZone::NameType mode =
                            type == Short ? QTimeZone::ShortName
                            : type == Long ? QTimeZone::LongName : QTimeZone::OffsetName;
                        text = when.timeRepresentation().displayName(when, mode, locale);
                        if (!text.isEmpty())
                            return text;
                        // else fall back to an unlocalized one if we can manage it:
                    } // else: prefer QDateTime's abbreviation, for backwards-compatibility.
#endif // else, make do with non-localized abbreviation:
                    // Absent timezone_locale data, Offset might still reach here:
                    if (type == Offset) // Our prior failure might not have tried this:
                        text = when.toOffsetFromUtc(when.offsetFromUtc()).timeZoneAbbreviation();
                    if (text.isEmpty()) // Notably including type != Offset
                        text = when.timeZoneAbbreviation();
                    return type == Offset ? offsetFromAbbreviation(std::move(text)) : text;
                };

                used = true;
                repeat = qMin(repeat, 4);
                // If we don't have a date-time, use the current system time:
                const QDateTime when = formatDate ? datetime : QDateTime::currentDateTime();
                QString text;
                switch (repeat) {
                case 4:
                    text = tzAbbr(when, Long);
                    break;
                case 3: // ±hh:mm
                case 2: // ±hhmm (we'll remove the ':' at the end)
                    text = tzAbbr(when, Offset);
                    if (repeat == 2)
                        text.remove(u':');
                    break;
                default:
                    text = tzAbbr(when, Short);
                    // UTC-offset zones only include minutes if non-zero.
                    if (text.startsWith("UTC"_L1) && text.size() == 6)
                        text += ":00"_L1;
                    break;
                }
                if (!text.isEmpty())
                    result.append(text);
                break;
            }

            default:
                break;
            }
        }
        if (!used)
            result.resize(result.size() + repeat, c);
        i += repeat;
    }

    return result;
}